

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemUtils.h
# Opt level: O0

uint64_t __thiscall FileSystemUtils::Path::GetFileSize(Path *this)

{
  int iVar1;
  char *__file;
  undefined1 local_b0 [8];
  stat buffer;
  uint64_t uStack_18;
  int error;
  uint64_t filesize;
  Path *this_local;
  
  uStack_18 = 0;
  buffer.__glibc_reserved[2]._4_4_ = 0xffffffff;
  __file = c_str(this);
  iVar1 = stat(__file,(stat *)local_b0);
  if (iVar1 == 0) {
    uStack_18 = buffer.st_rdev;
  }
  return uStack_18;
}

Assistant:

inline uint64_t	Path::GetFileSize()	const
	{
		uint64_t filesize = 0;
		int error = -1;
#ifdef _WIN32
		struct _stat64 buffer;
		std::wstring temp = _Win32Utf8ToUtf16( m_string );
		error = _wstat64( temp.c_str(), &buffer );
#else
		struct stat buffer;
		error = stat( c_str(), &buffer );
#endif
		if( 0 == error )
		{
			filesize = buffer.st_size;
		}
		return filesize;
	}